

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::JUnitReporter::JUnitReporter(JUnitReporter *this,ContextOptions *co)

{
  undefined8 in_RSI;
  ostream *in_RDI;
  XmlWriter *unaff_retaddr;
  JUnitTestCaseData *in_stack_ffffffffffffffe0;
  ostream *os;
  
  os = in_RDI;
  IReporter::IReporter((IReporter *)in_RDI);
  in_RDI->_vptr_basic_ostream = (_func_int **)&PTR_report_query_00261e80;
  XmlWriter::XmlWriter(unaff_retaddr,os);
  std::mutex::mutex((mutex *)0x15d4ba);
  detail::Timer::Timer((Timer *)&in_RDI->field_0x78);
  std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
            ((vector<doctest::String,_std::allocator<doctest::String>_> *)0x15d4d7);
  JUnitTestCaseData::JUnitTestCaseData(in_stack_ffffffffffffffe0);
  *(undefined8 *)&in_RDI->field_0xc0 = in_RSI;
  *(undefined8 *)&in_RDI->field_0xc8 = 0;
  return;
}

Assistant:

JUnitReporter(const ContextOptions& co)
                : xml(*co.cout)
                , opt(co) {}